

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O0

bool __thiscall senjo::UCIAdapter::Start(UCIAdapter *this,ChessEngine *chessEngine)

{
  bool bVar1;
  Output local_28;
  ChessEngine *local_20;
  ChessEngine *chessEngine_local;
  UCIAdapter *this_local;
  
  bVar1 = this->engine == (ChessEngine *)0x0;
  if (bVar1) {
    this->engine = chessEngine;
  }
  else {
    local_20 = chessEngine;
    chessEngine_local = (ChessEngine *)this;
    Output::Output(&local_28,InfoPrefix);
    Output::operator<<(&local_28,(char (*) [27])"UCIAdapter already started");
    Output::~Output(&local_28);
  }
  return bVar1;
}

Assistant:

bool UCIAdapter::Start(ChessEngine& chessEngine)
{
  if (engine) {
    Output() << "UCIAdapter already started";
    return false;
  }

  engine = &chessEngine;
  return true;
}